

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

shared_ptr<ot::commissioner::coap::Message> __thiscall
ot::commissioner::coap::Message::Deserialize(Message *this,Error *aError,ByteArray *aBuf)

{
  uint8_t *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer puVar1;
  OptionType aType;
  Error *pEVar2;
  bool bVar3;
  ushort uVar4;
  type tVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  char *pcVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  shared_ptr<ot::commissioner::coap::Message> sVar11;
  OptionType number;
  Error error;
  OptionValue value;
  OptionType local_11a;
  undefined1 local_118 [8];
  code *local_110;
  size_t local_108;
  ulong local_100;
  format_string_checker<char> *local_f8;
  parse_func local_f0 [1];
  uint local_e4;
  type local_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  Message *local_b8;
  size_t local_b0;
  string local_a8;
  Error *local_88;
  undefined1 local_80 [8];
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  uint8_t *local_58;
  ByteArray *local_50;
  OptionValue local_48;
  
  local_d8 = local_c8;
  local_e0 = 0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_b0 = 0;
  *(undefined8 *)&this->mHeader = 0;
  this_00 = (this->mHeader).mToken + 4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::coap::Message,std::allocator<ot::commissioner::coap::Message>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Message **)this,
             (allocator<ot::commissioner::coap::Message> *)local_118);
  local_88 = aError;
  local_58 = this_00;
  Deserialize((Error *)local_118,*(Header **)&this->mHeader,aBuf,&local_b0);
  local_e0 = local_118._0_4_;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
  tVar5 = local_e0;
  if (local_110 != (code *)&local_100) {
    operator_delete(local_110);
  }
  if (tVar5 == none_type) {
    if (**(byte **)&this->mHeader < 0x90 && (**(byte **)&this->mHeader & 3) == 1) {
      local_e4 = 0;
      local_b8 = this;
      local_50 = aBuf;
      do {
        puVar1 = (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
        if (uVar8 <= local_b0) break;
        if (puVar1[local_b0] == 0xff) {
          if (uVar8 <= local_b0 + 1) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)&local_a8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_80,(v10 *)"payload marker followed by empty payload",
                       (string_view)ZEXT816(0x28),args_01);
            local_118._0_4_ = 8;
            local_110 = (code *)&local_100;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,CONCAT44(local_80._4_4_,local_80._0_4_),
                       local_78 + CONCAT44(local_80._4_4_,local_80._0_4_));
            local_e0 = local_118._0_4_;
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
            if (local_110 != (code *)&local_100) {
              operator_delete(local_110);
            }
            paVar7 = &local_70;
            goto LAB_001cf03a;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                     (*(long *)&this->mHeader + 0x40),puVar1 + local_b0 + 1);
          break;
        }
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        in_R9.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_b0;
        Deserialize((Error *)local_118,&local_11a,&local_48,(uint16_t)local_e4,local_50,
                    (size_t *)in_R9.values_);
        local_e0 = local_118._0_4_;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
        tVar5 = local_e0;
        if (local_110 != (code *)&local_100) {
          operator_delete(local_110);
        }
        aType = local_11a;
        if (tVar5 == none_type) {
          bVar3 = IsValidOption(local_11a,&local_48);
          if (bVar3) {
            AppendOption((Error *)local_118,*(Message **)&local_b8->mHeader,aType,&local_48);
            local_e0 = local_118._0_4_;
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
            this = local_b8;
            if (local_110 != (code *)&local_100) {
              operator_delete(local_110);
              this = local_b8;
            }
          }
          else {
            local_118._0_4_ = custom_type;
            local_110 = (code *)0x230363;
            local_108 = 0x1a;
            local_100 = 0x100000000;
            local_f0[0] = ::fmt::v10::detail::
                          parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar10 = "bad CoAP option (number={}";
            local_f8 = (format_string_checker<char> *)local_118;
            do {
              pcVar6 = pcVar10 + 1;
              if (*pcVar10 == '}') {
                if ((pcVar6 == "") || (*pcVar6 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar6 = pcVar10 + 2;
              }
              else if (*pcVar10 == '{') {
                pcVar6 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                                   (pcVar10,"",(format_string_checker<char> *)local_118);
              }
              pcVar10 = pcVar6;
            } while (pcVar6 != "");
            local_118 = (undefined1  [8])&local_11a;
            local_110 = ::fmt::v10::detail::
                        value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                        format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
            ;
            fmt.size_ = 0xf;
            fmt.data_ = (char *)0x1a;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_118;
            ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"bad CoAP option (number={}",fmt,args);
            local_80._0_4_ = char_type;
            local_78 = local_70._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_78,local_a8._M_dataplus._M_p,
                       local_a8._M_dataplus._M_p + local_a8._M_string_length);
            local_e0 = local_80._0_4_;
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_78);
            if (local_78 != local_70._M_local_buf + 8) {
              operator_delete(local_78);
            }
            this = local_b8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
          }
          if (local_e0 != none_type) {
            uVar4 = (ushort)(local_11a - kIfMatch) >> 1 |
                    (ushort)((local_11a - kIfMatch & 1) != 0) << 0xf;
            if ((uVar4 < 0x14) && ((0xa01afU >> (uVar4 & 0x1f) & 1) != 0)) goto LAB_001cee7c;
            local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
            local_108 = 0;
            local_100 = local_100 & 0xffffffffffffff00;
            local_e0 = none_type;
            local_110 = (code *)&local_100;
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_110);
            if (local_110 != (code *)&local_100) {
              operator_delete(local_110);
            }
          }
          bVar3 = true;
          local_e4 = (uint)local_11a;
        }
        else {
LAB_001cee7c:
          bVar3 = false;
        }
        if (local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.mValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      } while (bVar3);
    }
    else {
      local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
      local_110 = (code *)0x23002e;
      local_108 = 0x1b;
      local_100 = 0;
      local_f0[0] = (parse_func)0x0;
      pcVar10 = "invalid CoAP message header";
      local_f8 = (format_string_checker<char> *)local_118;
      do {
        pcVar6 = pcVar10 + 1;
        if (*pcVar10 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar10 + 2;
        }
        else if (*pcVar10 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar10,"",(format_string_checker<char> *)local_118);
        }
        pcVar10 = pcVar6;
      } while (pcVar6 != "");
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_118;
      ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)0x23002e,(string_view)ZEXT816(0x1b),args_00);
      local_80._0_4_ = char_type;
      local_78 = local_70._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      local_e0 = local_80._0_4_;
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_78);
      if (local_78 != local_70._M_local_buf + 8) {
        operator_delete(local_78);
      }
      paVar7 = &local_a8.field_2;
LAB_001cf03a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar7->_M_local_buf + -0x10) != paVar7) {
        operator_delete(*(undefined1 **)(paVar7->_M_local_buf + -0x10));
      }
    }
  }
  pEVar2 = local_88;
  if (local_e0 == none_type) {
    tVar5 = none_type;
  }
  else {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((this->mHeader).mToken + 4);
    *(undefined8 *)&this->mHeader = 0;
    *(undefined8 *)((this->mHeader).mToken + 4) = 0;
    tVar5 = local_e0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      tVar5 = local_e0;
    }
  }
  pEVar2->mCode = tVar5;
  std::__cxx11::string::_M_assign((string *)&pEVar2->mMessage);
  _Var9._M_pi = extraout_RDX;
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
    _Var9._M_pi = extraout_RDX_00;
  }
  sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var9._M_pi;
  sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<ot::commissioner::coap::Message>)
         sVar11.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Message> Message::Deserialize(Error &aError, const ByteArray &aBuf)
{
    Error    error;
    size_t   offset = 0;
    uint16_t lastOptionNumber;
    auto     message = std::make_shared<Message>();

    SuccessOrExit(error = Deserialize(message->mHeader, aBuf, offset));
    VerifyOrExit(message->mHeader.IsValid(), error = ERROR_BAD_FORMAT("invalid CoAP message header"));

    lastOptionNumber = 0;
    while (offset < aBuf.size() && aBuf[offset] != kPayloadMarker)
    {
        OptionType  number;
        OptionValue value;

        SuccessOrExit(error = Deserialize(number, value, lastOptionNumber, aBuf, offset));

        if (IsValidOption(number, value))
        {
            // AppendOption will do further validation before adding the option.
            error = message->AppendOption(number, value);
        }
        else
        {
            error = ERROR_BAD_FORMAT("bad CoAP option (number={}", number);
        }

        if (error != ErrorCode::kNone)
        {
            if (IsCriticalOption(number))
            {
                // Stop if any unrecognized option is critical.
                ExitNow();
            }
            else
            {
                // Ignore non-critical option error.
                error = ERROR_NONE;
            }
        }

        lastOptionNumber = utils::to_underlying(number);
    }

    if (offset < aBuf.size())
    {
        if (aBuf[offset++] == kPayloadMarker)
        {
            VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("payload marker followed by empty payload"));
            message->mPayload.assign(aBuf.begin() + offset, aBuf.end());
        }
        else
        {
            // Ignore extra data.
            message->mPayload.clear();
        }
    }

exit:
    if (error != ErrorCode::kNone)
    {
        message = nullptr;
    }
    aError = error;
    return message;
}